

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

int trytop(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *pxVar2;
  rnndb *prVar3;
  xmlNode *attr;
  int iVar4;
  int iVar5;
  int iVar6;
  uint64_t uVar7;
  rnnenum *prVar8;
  rnnenum **__ptr;
  rnnvalue *prVar9;
  rnnvalue **__ptr_00;
  rnnbitset *prVar10;
  rnnbitset **__ptr_01;
  rnnbitfield *prVar11;
  rnnbitfield **__ptr_02;
  char *pcVar12;
  char *pcVar13;
  rnngroup *prVar14;
  rnngroup **__ptr_03;
  rnnspectype *prVar15;
  rnnspectype **__ptr_04;
  rnndomain *prVar16;
  rnndomain **__ptr_05;
  rnnauthor *prVar17;
  char *pcVar18;
  char **__ptr_06;
  rnnauthor **__ptr_07;
  rnndelem *prVar19;
  rnndelem **pprVar20;
  xmlNode *node_00;
  xmlNode *node_01;
  xmlNode *node_02;
  xmlNode *node_03;
  xmlNode *node_04;
  ulong uVar21;
  _xmlAttr **pp_Var22;
  ulong uVar23;
  _xmlNode *p_Var24;
  _xmlAttr *attr_00;
  uint uVar25;
  _xmlNode **pp_Var26;
  uint64_t local_68;
  char *local_50;
  char *local_48;
  char *local_40;
  
  pxVar1 = node->name;
  iVar4 = strcmp((char *)pxVar1,"enum");
  if (iVar4 == 0) {
    pcVar12 = (char *)0x0;
    iVar6 = 0;
    iVar4 = 0;
    local_48 = (char *)0x0;
    local_50 = (char *)0x0;
    pcVar18 = (char *)0x0;
    pp_Var22 = &node->properties;
    while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar5 = strcmp((char *)pxVar1,"name");
      if (iVar5 == 0) {
        pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        iVar5 = strcmp((char *)pxVar1,"bare");
        if (iVar5 == 0) {
          iVar4 = getboolattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"inline");
          if (iVar5 == 0) {
            iVar6 = getboolattrib(db,file,(uint)node->line,pxVar2);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"prefix");
            if (iVar5 == 0) {
              pcVar13 = getattrib(db,file,(uint)node->line,pxVar2);
              local_48 = strdup(pcVar13);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"varset");
              if (iVar5 == 0) {
                pcVar13 = getattrib(db,file,(uint)node->line,pxVar2);
                local_50 = strdup(pcVar13);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"variants");
                if (iVar5 == 0) {
                  pcVar18 = getattrib(db,file,(uint)node->line,pxVar2);
                  pcVar18 = strdup(pcVar18);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for enum\n",file,(ulong)node->line,
                          pxVar1);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
      pp_Var22 = &pxVar2->next;
    }
    if (pcVar12 != (char *)0x0) {
      uVar25 = db->enumsnum;
      uVar23 = 0;
      uVar21 = 0;
      if (0 < (int)uVar25) {
        uVar21 = (ulong)uVar25;
      }
      do {
        if (uVar21 == uVar23) {
          prVar8 = (rnnenum *)calloc(0x78,1);
          pcVar12 = strdup(pcVar12);
          prVar8->name = pcVar12;
          prVar8->isinline = iVar6;
          prVar8->bare = iVar4;
          (prVar8->varinfo).prefixstr = local_48;
          (prVar8->varinfo).varsetstr = local_50;
          (prVar8->varinfo).variantsstr = pcVar18;
          prVar8->file = file;
          iVar4 = db->enumsmax;
          __ptr = db->enums;
          if (iVar4 <= (int)uVar25) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->enumsmax = iVar6;
            __ptr = (rnnenum **)realloc(__ptr,(long)iVar6 << 3);
            db->enums = __ptr;
            uVar25 = db->enumsnum;
          }
          db->enumsnum = uVar25 + 1;
          __ptr[(int)uVar25] = prVar8;
          goto LAB_00101ccf;
        }
        prVar8 = db->enums[uVar23];
        iVar5 = strcmp(prVar8->name,pcVar12);
        uVar23 = uVar23 + 1;
      } while (iVar5 != 0);
      iVar5 = strdiff((prVar8->varinfo).prefixstr,local_48);
      if ((((iVar5 != 0) || (iVar5 = strdiff((prVar8->varinfo).varsetstr,local_50), iVar5 != 0)) ||
          (iVar5 = strdiff((prVar8->varinfo).variantsstr,pcVar18), iVar5 != 0)) ||
         ((prVar8->isinline != iVar6 || (prVar8->bare != iVar4)))) {
        fprintf(_stderr,"%s:%d: merge fail for enum %s\n",file,(ulong)node->line,node->name);
        db->estatus = 1;
      }
      free(local_48);
      free(local_50);
      free(pcVar18);
LAB_00101ccf:
      pp_Var26 = &node->children;
      while (prVar3 = (rnndb *)*pp_Var26, prVar3 != (rnndb *)0x0) {
        if (*(int *)&(prVar3->copyright).license == 1) {
          iVar4 = strcmp((char *)(prVar3->copyright).authors,"value");
          if (iVar4 == 0) {
            prVar9 = parsevalue(db,file,(xmlNode *)prVar3);
            if (prVar9 != (rnnvalue *)0x0) {
              iVar4 = prVar8->valsnum;
              iVar6 = prVar8->valsmax;
              __ptr_00 = prVar8->vals;
              if (iVar6 <= iVar4) {
                iVar4 = iVar6 * 2;
                if (iVar6 == 0) {
                  iVar4 = 0x10;
                }
                prVar8->valsmax = iVar4;
                __ptr_00 = (rnnvalue **)realloc(__ptr_00,(long)iVar4 << 3);
                prVar8->vals = __ptr_00;
                iVar4 = prVar8->valsnum;
              }
              prVar8->valsnum = iVar4 + 1;
              __ptr_00[iVar4] = prVar9;
            }
          }
          else {
            pcVar18 = file;
            iVar4 = trytop(db,file,(xmlNode *)prVar3);
            if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar18,node_00), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in enum: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
          }
        }
        pp_Var26 = (_xmlNode **)&prVar3->bitsets;
      }
      return 1;
    }
    uVar21 = (ulong)node->line;
    pcVar18 = "%s:%d: nameless enum\n";
LAB_00102c77:
    fprintf(_stderr,pcVar18,file,uVar21);
    db->estatus = 1;
    return 1;
  }
  iVar4 = strcmp((char *)pxVar1,"bitset");
  if (iVar4 == 0) {
    pcVar12 = (char *)0x0;
    iVar6 = 0;
    iVar4 = 0;
    local_48 = (char *)0x0;
    local_50 = (char *)0x0;
    pcVar18 = (char *)0x0;
    pp_Var22 = &node->properties;
    while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar5 = strcmp((char *)pxVar1,"name");
      if (iVar5 == 0) {
        pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        iVar5 = strcmp((char *)pxVar1,"bare");
        if (iVar5 == 0) {
          iVar4 = getboolattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"inline");
          if (iVar5 == 0) {
            iVar6 = getboolattrib(db,file,(uint)node->line,pxVar2);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"prefix");
            if (iVar5 == 0) {
              pcVar13 = getattrib(db,file,(uint)node->line,pxVar2);
              local_48 = strdup(pcVar13);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"varset");
              if (iVar5 == 0) {
                pcVar13 = getattrib(db,file,(uint)node->line,pxVar2);
                local_50 = strdup(pcVar13);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"variants");
                if (iVar5 == 0) {
                  pcVar18 = getattrib(db,file,(uint)node->line,pxVar2);
                  pcVar18 = strdup(pcVar18);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitset\n",file,
                          (ulong)node->line,pxVar1);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
      pp_Var22 = &pxVar2->next;
    }
    if (pcVar12 != (char *)0x0) {
      uVar25 = db->bitsetsnum;
      uVar23 = 0;
      uVar21 = 0;
      if (0 < (int)uVar25) {
        uVar21 = (ulong)uVar25;
      }
      do {
        if (uVar21 == uVar23) {
          prVar10 = (rnnbitset *)calloc(0x70,1);
          pcVar12 = strdup(pcVar12);
          prVar10->name = pcVar12;
          prVar10->isinline = iVar6;
          prVar10->bare = iVar4;
          (prVar10->varinfo).prefixstr = local_48;
          (prVar10->varinfo).varsetstr = local_50;
          (prVar10->varinfo).variantsstr = pcVar18;
          prVar10->file = file;
          iVar4 = db->bitsetsmax;
          __ptr_01 = db->bitsets;
          if (iVar4 <= (int)uVar25) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->bitsetsmax = iVar6;
            __ptr_01 = (rnnbitset **)realloc(__ptr_01,(long)iVar6 << 3);
            db->bitsets = __ptr_01;
            uVar25 = db->bitsetsnum;
          }
          db->bitsetsnum = uVar25 + 1;
          __ptr_01[(int)uVar25] = prVar10;
          goto LAB_00101f26;
        }
        prVar10 = db->bitsets[uVar23];
        iVar5 = strcmp(prVar10->name,pcVar12);
        uVar23 = uVar23 + 1;
      } while (iVar5 != 0);
      iVar5 = strdiff((prVar10->varinfo).prefixstr,local_48);
      if ((((iVar5 != 0) || (iVar5 = strdiff((prVar10->varinfo).varsetstr,local_50), iVar5 != 0)) ||
          (iVar5 = strdiff((prVar10->varinfo).variantsstr,pcVar18), iVar5 != 0)) ||
         ((prVar10->isinline != iVar6 || (prVar10->bare != iVar4)))) {
        fprintf(_stderr,"%s:%d: merge fail for bitset %s\n",file,(ulong)node->line,node->name);
        db->estatus = 1;
      }
      free(local_48);
      free(local_50);
      free(pcVar18);
LAB_00101f26:
      pp_Var26 = &node->children;
      while (prVar3 = (rnndb *)*pp_Var26, prVar3 != (rnndb *)0x0) {
        if (*(int *)&(prVar3->copyright).license == 1) {
          iVar4 = strcmp((char *)(prVar3->copyright).authors,"bitfield");
          if (iVar4 == 0) {
            prVar11 = parsebitfield(db,file,(xmlNode *)prVar3);
            if (prVar11 != (rnnbitfield *)0x0) {
              iVar4 = prVar10->bitfieldsnum;
              iVar6 = prVar10->bitfieldsmax;
              __ptr_02 = prVar10->bitfields;
              if (iVar6 <= iVar4) {
                iVar4 = iVar6 * 2;
                if (iVar6 == 0) {
                  iVar4 = 0x10;
                }
                prVar10->bitfieldsmax = iVar4;
                __ptr_02 = (rnnbitfield **)realloc(__ptr_02,(long)iVar4 << 3);
                prVar10->bitfields = __ptr_02;
                iVar4 = prVar10->bitfieldsnum;
              }
              prVar10->bitfieldsnum = iVar4 + 1;
              __ptr_02[iVar4] = prVar11;
            }
          }
          else {
            pcVar18 = file;
            iVar4 = trytop(db,file,(xmlNode *)prVar3);
            if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar18,node_01), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in bitset: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
          }
        }
        pp_Var26 = (_xmlNode **)&prVar3->bitsets;
      }
      return 1;
    }
    uVar21 = (ulong)node->line;
    pcVar18 = "%s:%d: nameless bitset\n";
    goto LAB_00102c77;
  }
  iVar4 = strcmp((char *)pxVar1,"group");
  if (iVar4 == 0) {
    pcVar18 = (char *)0x0;
    pp_Var22 = &node->properties;
    while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
      pxVar1 = pxVar2->name;
      iVar4 = strcmp((char *)pxVar1,"name");
      if (iVar4 == 0) {
        pcVar18 = getattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for group\n",file,(ulong)node->line,pxVar1);
        db->estatus = 1;
      }
      pp_Var22 = &pxVar2->next;
    }
    if (pcVar18 != (char *)0x0) {
      uVar25 = db->groupsnum;
      uVar23 = 0;
      uVar21 = 0;
      if (0 < (int)uVar25) {
        uVar21 = (ulong)uVar25;
      }
      do {
        if (uVar21 == uVar23) {
          prVar14 = (rnngroup *)calloc(0x18,1);
          pcVar18 = strdup(pcVar18);
          prVar14->name = pcVar18;
          iVar4 = db->groupsmax;
          __ptr_03 = db->groups;
          if (iVar4 <= (int)uVar25) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->groupsmax = iVar6;
            __ptr_03 = (rnngroup **)realloc(__ptr_03,(long)iVar6 << 3);
            db->groups = __ptr_03;
            uVar25 = db->groupsnum;
          }
          db->groupsnum = uVar25 + 1;
          __ptr_03[(int)uVar25] = prVar14;
          break;
        }
        prVar14 = db->groups[uVar23];
        iVar4 = strcmp(prVar14->name,pcVar18);
        uVar23 = uVar23 + 1;
      } while (iVar4 != 0);
      pp_Var26 = &node->children;
      while (prVar3 = (rnndb *)*pp_Var26, prVar3 != (rnndb *)0x0) {
        if (*(int *)&(prVar3->copyright).license == 1) {
          prVar19 = trydelem(db,file,(xmlNode *)prVar3);
          if (prVar19 == (rnndelem *)0x0) {
            pcVar18 = file;
            iVar4 = trytop(db,file,(xmlNode *)prVar3);
            if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar18,node_02), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in group: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
          }
          else {
            iVar4 = prVar14->subelemsnum;
            iVar6 = prVar14->subelemsmax;
            pprVar20 = prVar14->subelems;
            if (iVar6 <= iVar4) {
              iVar4 = iVar6 * 2;
              if (iVar6 == 0) {
                iVar4 = 0x10;
              }
              prVar14->subelemsmax = iVar4;
              pprVar20 = (rnndelem **)realloc(pprVar20,(long)iVar4 << 3);
              prVar14->subelems = pprVar20;
              iVar4 = prVar14->subelemsnum;
            }
            prVar14->subelemsnum = iVar4 + 1;
            pprVar20[iVar4] = prVar19;
          }
        }
        pp_Var26 = (_xmlNode **)&prVar3->bitsets;
      }
      return 1;
    }
    uVar21 = (ulong)node->line;
    pcVar18 = "%s:%d: nameless group\n";
    goto LAB_00102c77;
  }
  iVar4 = strcmp((char *)pxVar1,"domain");
  if (iVar4 != 0) {
    iVar4 = strcmp((char *)pxVar1,"spectype");
    if (iVar4 == 0) {
      prVar15 = (rnnspectype *)calloc(0x90,1);
      prVar15->file = file;
      pp_Var22 = &node->properties;
      while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
        iVar4 = strcmp((char *)pxVar2->name,"name");
        if (iVar4 == 0) {
          pcVar18 = getattrib(db,file,(uint)node->line,pxVar2);
          pcVar18 = strdup(pcVar18);
          prVar15->name = pcVar18;
        }
        else {
          iVar4 = trytypeattr(db,file,node,pxVar2,&prVar15->typeinfo);
          if (iVar4 == 0) {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",file,(ulong)node->line,
                    pxVar2->name);
            db->estatus = 1;
          }
        }
        pp_Var22 = &pxVar2->next;
      }
      pcVar18 = prVar15->name;
      if (pcVar18 == (char *)0x0) {
        uVar21 = (ulong)node->line;
        pcVar18 = "%s:%d: nameless spectype\n";
        goto LAB_00102c77;
      }
      uVar25 = db->spectypesnum;
      uVar23 = 0;
      uVar21 = 0;
      if (0 < (int)uVar25) {
        uVar21 = (ulong)uVar25;
      }
      do {
        if (uVar21 == uVar23) {
          iVar4 = db->spectypesmax;
          __ptr_04 = db->spectypes;
          if (iVar4 <= (int)uVar25) {
            iVar6 = iVar4 * 2;
            if (iVar4 == 0) {
              iVar6 = 0x10;
            }
            db->spectypesmax = iVar6;
            __ptr_04 = (rnnspectype **)realloc(__ptr_04,(long)iVar6 << 3);
            db->spectypes = __ptr_04;
            uVar25 = db->spectypesnum;
          }
          db->spectypesnum = uVar25 + 1;
          __ptr_04[(int)uVar25] = prVar15;
          pp_Var26 = &node->children;
          while (prVar3 = (rnndb *)*pp_Var26, prVar3 != (rnndb *)0x0) {
            if ((((*(int *)&(prVar3->copyright).license == 1) &&
                 (iVar4 = trytypetag(db,file,(xmlNode *)prVar3,&prVar15->typeinfo), iVar4 == 0)) &&
                (pcVar18 = file, iVar4 = trytop(db,file,(xmlNode *)prVar3), iVar4 == 0)) &&
               (iVar4 = trydoc(prVar3,pcVar18,node_03), iVar4 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",file,
                      (ulong)*(ushort *)&prVar3->files,(prVar3->copyright).authors);
              db->estatus = 1;
            }
            pp_Var26 = (_xmlNode **)&prVar3->bitsets;
          }
          return 1;
        }
        iVar4 = strcmp(db->spectypes[uVar23]->name,pcVar18);
        uVar23 = uVar23 + 1;
      } while (iVar4 != 0);
      fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",file,(ulong)node->line,pcVar18);
    }
    else {
      iVar4 = strcmp((char *)pxVar1,"import");
      if (iVar4 != 0) {
        iVar4 = strcmp((char *)pxVar1,"copyright");
        if (iVar4 != 0) {
          return 0;
        }
        pp_Var22 = &node->properties;
        while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
          pxVar1 = pxVar2->name;
          iVar4 = strcmp((char *)pxVar1,"year");
          if (iVar4 == 0) {
            uVar7 = getnumattrib(db,file,(uint)node->line,pxVar2);
            if ((uint)uVar7 <= (db->copyright).firstyear - 1) {
              (db->copyright).firstyear = (uint)uVar7;
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",file,(ulong)node->line,
                    pxVar1);
            db->estatus = 1;
          }
          pp_Var22 = &pxVar2->next;
        }
        pp_Var26 = &node->children;
        do {
          attr = *pp_Var26;
          if (attr == (xmlNode *)0x0) {
            return 1;
          }
          if (attr->type == XML_ELEMENT_NODE) {
            pxVar1 = attr->name;
            iVar4 = strcmp((char *)pxVar1,"license");
            if (iVar4 == 0) {
              pcVar18 = (db->copyright).license;
              if (pcVar18 == (char *)0x0) {
                pcVar18 = getcontent(attr);
                (db->copyright).license = pcVar18;
              }
              else {
                iVar4 = strcmp(pcVar18,(char *)node->content);
                if (iVar4 != 0) {
                  fwrite("fatal error: multiple different licenses specified!\n",0x34,1,_stderr);
                  abort();
                }
              }
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"author");
              if (iVar4 == 0) {
                prVar17 = (rnnauthor *)calloc(0x30,1);
                p_Var24 = attr->children;
                attr_00 = attr->properties;
                pcVar18 = getcontent(attr);
                prVar17->contributions = pcVar18;
                for (; attr_00 != (xmlAttr *)0x0; attr_00 = attr_00->next) {
                  pxVar1 = attr_00->name;
                  iVar4 = strcmp((char *)pxVar1,"name");
                  if (iVar4 == 0) {
                    pcVar18 = getattrib(db,file,(uint)attr->line,attr_00);
                    pcVar18 = strdup(pcVar18);
                    prVar17->name = pcVar18;
                  }
                  else {
                    iVar4 = strcmp((char *)pxVar1,"email");
                    if (iVar4 == 0) {
                      pcVar18 = getattrib(db,file,(uint)attr->line,attr_00);
                      pcVar18 = strdup(pcVar18);
                      prVar17->email = pcVar18;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",file,
                              (ulong)attr->line,pxVar1);
                      db->estatus = 1;
                    }
                  }
                }
                for (; p_Var24 != (_xmlNode *)0x0; p_Var24 = p_Var24->next) {
                  if (p_Var24->type == XML_ELEMENT_NODE) {
                    pxVar1 = p_Var24->name;
                    iVar4 = strcmp((char *)pxVar1,"nick");
                    if (iVar4 == 0) {
                      pcVar18 = (char *)0x0;
                      pp_Var22 = &p_Var24->properties;
                      while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
                        pxVar1 = pxVar2->name;
                        iVar4 = strcmp((char *)pxVar1,"name");
                        if (iVar4 == 0) {
                          pcVar18 = getattrib(db,file,(uint)p_Var24->line,pxVar2);
                          pcVar18 = strdup(pcVar18);
                        }
                        else {
                          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",file,
                                  (ulong)p_Var24->line,pxVar1);
                          db->estatus = 1;
                        }
                        pp_Var22 = &pxVar2->next;
                      }
                      if (pcVar18 != (char *)0x0) {
                        iVar4 = prVar17->nicknamesnum;
                        iVar6 = prVar17->nicknamesmax;
                        __ptr_06 = prVar17->nicknames;
                        if (iVar6 <= iVar4) {
                          iVar4 = iVar6 * 2;
                          if (iVar6 == 0) {
                            iVar4 = 0x10;
                          }
                          prVar17->nicknamesmax = iVar4;
                          __ptr_06 = (char **)realloc(__ptr_06,(long)iVar4 << 3);
                          prVar17->nicknames = __ptr_06;
                          iVar4 = prVar17->nicknamesnum;
                        }
                        prVar17->nicknamesnum = iVar4 + 1;
                        __ptr_06[iVar4] = pcVar18;
                        goto LAB_001029ba;
                      }
                      fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",file,
                              (ulong)p_Var24->line);
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",file,(ulong)p_Var24->line
                              ,pxVar1);
                    }
                    db->estatus = 1;
                  }
LAB_001029ba:
                }
                iVar4 = (db->copyright).authorsnum;
                iVar6 = (db->copyright).authorsmax;
                __ptr_07 = (db->copyright).authors;
                if (iVar6 <= iVar4) {
                  iVar4 = iVar6 * 2;
                  if (iVar6 == 0) {
                    iVar4 = 0x10;
                  }
                  (db->copyright).authorsmax = iVar4;
                  __ptr_07 = (rnnauthor **)realloc(__ptr_07,(long)iVar4 << 3);
                  (db->copyright).authors = __ptr_07;
                  iVar4 = (db->copyright).authorsnum;
                }
                (db->copyright).authorsnum = iVar4 + 1;
                __ptr_07[iVar4] = prVar17;
              }
              else {
                fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",file,(ulong)attr->line,
                        pxVar1);
                db->estatus = 1;
              }
            }
          }
          pp_Var26 = &attr->next;
        } while( true );
      }
      pcVar18 = (char *)0x0;
      pp_Var22 = &node->properties;
      while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
        pxVar1 = pxVar2->name;
        iVar4 = strcmp((char *)pxVar1,"file");
        if (iVar4 == 0) {
          pcVar18 = getattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",file,(ulong)node->line,pxVar1
                 );
          db->estatus = 1;
        }
        pp_Var22 = &pxVar2->next;
      }
      if (pcVar18 != (char *)0x0) {
        rnn_parsefile(db,pcVar18);
        return 1;
      }
      fprintf(_stderr,"%s:%d: missing \"file\" attribute for import\n",file,(ulong)node->line);
    }
    db->estatus = 1;
    return 1;
  }
  local_48 = (char *)0x8;
  pcVar12 = (char *)0x0;
  local_68 = 0;
  iVar4 = 0;
  local_50 = (char *)0x0;
  local_40 = (char *)0x0;
  pcVar18 = (char *)0x0;
  pp_Var22 = &node->properties;
  while (pxVar2 = *pp_Var22, pxVar2 != (xmlAttr *)0x0) {
    pxVar1 = pxVar2->name;
    iVar6 = strcmp((char *)pxVar1,"name");
    if (iVar6 == 0) {
      pcVar12 = getattrib(db,file,(uint)node->line,pxVar2);
    }
    else {
      iVar6 = strcmp((char *)pxVar1,"bare");
      if (iVar6 == 0) {
        iVar4 = getboolattrib(db,file,(uint)node->line,pxVar2);
      }
      else {
        iVar6 = strcmp((char *)pxVar1,"size");
        if (iVar6 == 0) {
          local_68 = getnumattrib(db,file,(uint)node->line,pxVar2);
        }
        else {
          iVar6 = strcmp((char *)pxVar1,"width");
          if (iVar6 == 0) {
            local_48 = (char *)getnumattrib(db,file,(uint)node->line,pxVar2);
          }
          else {
            iVar6 = strcmp((char *)pxVar1,"prefix");
            if (iVar6 == 0) {
              pcVar13 = getattrib(db,file,(uint)node->line,pxVar2);
              local_50 = strdup(pcVar13);
            }
            else {
              iVar6 = strcmp((char *)pxVar1,"varset");
              if (iVar6 == 0) {
                pcVar13 = getattrib(db,file,(uint)node->line,pxVar2);
                local_40 = strdup(pcVar13);
              }
              else {
                iVar6 = strcmp((char *)pxVar1,"variants");
                if (iVar6 == 0) {
                  pcVar18 = getattrib(db,file,(uint)node->line,pxVar2);
                  pcVar18 = strdup(pcVar18);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for domain\n",file,
                          (ulong)node->line,pxVar1);
                  db->estatus = 1;
                }
              }
            }
          }
        }
      }
    }
    pp_Var22 = &pxVar2->next;
  }
  if (pcVar12 == (char *)0x0) {
    uVar21 = (ulong)node->line;
    pcVar18 = "%s:%d: nameless domain\n";
    goto LAB_00102c77;
  }
  uVar25 = db->domainsnum;
  uVar23 = 0;
  uVar21 = 0;
  if (0 < (int)uVar25) {
    uVar21 = (ulong)uVar25;
  }
  do {
    if (uVar21 == uVar23) {
      prVar16 = (rnndomain *)calloc(0x80,1);
      pcVar12 = strdup(pcVar12);
      prVar16->name = pcVar12;
      prVar16->bare = iVar4;
      prVar16->width = (int)local_48;
      prVar16->size = local_68;
      (prVar16->varinfo).prefixstr = local_50;
      (prVar16->varinfo).varsetstr = local_40;
      (prVar16->varinfo).variantsstr = pcVar18;
      prVar16->file = file;
      iVar4 = db->domainsmax;
      __ptr_05 = db->domains;
      if (iVar4 <= (int)uVar25) {
        iVar6 = iVar4 * 2;
        if (iVar4 == 0) {
          iVar6 = 0x10;
        }
        db->domainsmax = iVar6;
        __ptr_05 = (rnndomain **)realloc(__ptr_05,(long)iVar6 << 3);
        db->domains = __ptr_05;
        uVar25 = db->domainsnum;
      }
      db->domainsnum = uVar25 + 1;
      __ptr_05[(int)uVar25] = prVar16;
      goto LAB_00102b5c;
    }
    prVar16 = db->domains[uVar23];
    iVar6 = strcmp(prVar16->name,pcVar12);
    uVar23 = uVar23 + 1;
  } while (iVar6 != 0);
  iVar6 = strdiff((prVar16->varinfo).prefixstr,local_50);
  if (((iVar6 == 0) && (iVar6 = strdiff((prVar16->varinfo).varsetstr,local_40), iVar6 == 0)) &&
     ((iVar6 = strdiff((prVar16->varinfo).variantsstr,pcVar18), iVar6 == 0 &&
      ((prVar16->width == (int)local_48 && (prVar16->bare == iVar4)))))) {
    if (local_68 == 0) goto LAB_00102b42;
    if ((prVar16->size == 0) || (local_68 == prVar16->size)) {
      prVar16->size = local_68;
      goto LAB_00102b42;
    }
  }
  fprintf(_stderr,"%s:%d: merge fail for domain %s\n",file,(ulong)node->line,node->name);
  db->estatus = 1;
LAB_00102b42:
  free(local_50);
  free(local_40);
  free(pcVar18);
LAB_00102b5c:
  pp_Var26 = &node->children;
  while (prVar3 = (rnndb *)*pp_Var26, prVar3 != (rnndb *)0x0) {
    if (*(int *)&(prVar3->copyright).license == 1) {
      prVar19 = trydelem(db,file,(xmlNode *)prVar3);
      if (prVar19 == (rnndelem *)0x0) {
        pcVar18 = file;
        iVar4 = trytop(db,file,(xmlNode *)prVar3);
        if ((iVar4 == 0) && (iVar4 = trydoc(prVar3,pcVar18,node_04), iVar4 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in domain: <%s>\n",file,(ulong)*(ushort *)&prVar3->files
                  ,(prVar3->copyright).authors);
          db->estatus = 1;
        }
      }
      else {
        iVar4 = prVar16->subelemsnum;
        iVar6 = prVar16->subelemsmax;
        pprVar20 = prVar16->subelems;
        if (iVar6 <= iVar4) {
          iVar4 = iVar6 * 2;
          if (iVar6 == 0) {
            iVar4 = 0x10;
          }
          prVar16->subelemsmax = iVar4;
          pprVar20 = (rnndelem **)realloc(pprVar20,(long)iVar4 << 3);
          prVar16->subelems = pprVar20;
          iVar4 = prVar16->subelemsnum;
        }
        prVar16->subelemsnum = iVar4 + 1;
        pprVar20[iVar4] = prVar19;
      }
    }
    pp_Var26 = (_xmlNode **)&prVar3->bitsets;
  }
  return 1;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}